

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

uint256 * __thiscall
CPartialMerkleTree::ExtractMatches
          (CPartialMerkleTree *this,vector<uint256,_std::allocator<uint256>_> *vMatch,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnIndex)

{
  long lVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  uint *in_RCX;
  uint256 *in_RDX;
  uint *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  int nHeight;
  uint nHashUsed;
  uint nBitsUsed;
  uint256 hashMerkleRoot;
  uint256 *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  CPartialMerkleTree *in_stack_ffffffffffffff78;
  uint *puVar5;
  int iVar6;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  uint in_stack_ffffffffffffffec;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = in_RSI;
  std::vector<uint256,_std::allocator<uint256>_>::clear
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff68);
  if (*in_RSI == 0) {
    memset(in_RDI,0,0x20);
    uint256::uint256(in_stack_ffffffffffffff68);
  }
  else if (*in_RSI < 0x411b) {
    sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff68);
    if (*in_RSI < sVar3) {
      memset(in_RDI,0,0x20);
      uint256::uint256(in_stack_ffffffffffffff68);
    }
    else {
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff78);
      sVar4 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff68);
      if (sVar3 < sVar4) {
        memset(in_RDI,0,0x20);
        uint256::uint256(in_stack_ffffffffffffff68);
      }
      else {
        do {
          uVar2 = CalcTreeWidth(in_stack_ffffffffffffff78,
                                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        } while (1 < uVar2);
        iVar6 = 0;
        uVar2 = 0;
        TraverseAndExtract((CPartialMerkleTree *)0x0,(int)((ulong)puVar5 >> 0x20),
                           in_stack_ffffffffffffffec,(uint *)in_RDX,in_RCX,
                           (vector<uint256,_std::allocator<uint256>_> *)this,_nHashUsed);
        if ((in_RSI[0x12] & 1) == 0) {
          sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff78);
          if ((ulong)(iVar6 + 7U >> 3) == sVar3 + 7 >> 3) {
            sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                              ((vector<uint256,_std::allocator<uint256>_> *)in_RDX);
            if (uVar2 == sVar3) {
              *(undefined8 *)(in_RDI->super_base_blob<256U>).m_data._M_elems = local_28;
              *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8) = local_20;
              *(ulong *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x10) =
                   CONCAT44(in_stack_ffffffffffffffec,local_18);
              *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x18) = local_10;
            }
            else {
              memset(in_RDI,0,0x20);
              uint256::uint256(in_RDX);
            }
          }
          else {
            memset(in_RDI,0,0x20);
            uint256::uint256(in_RDX);
          }
        }
        else {
          memset(in_RDI,0,0x20);
          uint256::uint256(in_RDX);
        }
      }
    }
  }
  else {
    memset(in_RDI,0,0x20);
    uint256::uint256(in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

uint256 CPartialMerkleTree::ExtractMatches(std::vector<uint256> &vMatch, std::vector<unsigned int> &vnIndex) {
    vMatch.clear();
    // An empty set will not work
    if (nTransactions == 0)
        return uint256();
    // check for excessively high numbers of transactions
    if (nTransactions > MAX_BLOCK_WEIGHT / MIN_TRANSACTION_WEIGHT)
        return uint256();
    // there can never be more hashes provided than one for every txid
    if (vHash.size() > nTransactions)
        return uint256();
    // there must be at least one bit per node in the partial tree, and at least one node per hash
    if (vBits.size() < vHash.size())
        return uint256();
    // calculate height of tree
    int nHeight = 0;
    while (CalcTreeWidth(nHeight) > 1)
        nHeight++;
    // traverse the partial tree
    unsigned int nBitsUsed = 0, nHashUsed = 0;
    uint256 hashMerkleRoot = TraverseAndExtract(nHeight, 0, nBitsUsed, nHashUsed, vMatch, vnIndex);
    // verify that no problems occurred during the tree traversal
    if (fBad)
        return uint256();
    // verify that all bits were consumed (except for the padding caused by serializing it as a byte sequence)
    if ((nBitsUsed+7)/8 != (vBits.size()+7)/8)
        return uint256();
    // verify that all hashes were consumed
    if (nHashUsed != vHash.size())
        return uint256();
    return hashMerkleRoot;
}